

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  WhereMaskSet *pMaskSet;
  u32 *puVar1;
  Bitmask *pBVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  LogEst LVar6;
  undefined2 uVar7;
  WhereInfo *pWVar8;
  Parse *pParse;
  sqlite3 *db;
  Parse *pParse_00;
  sqlite3 *psVar9;
  undefined8 *puVar10;
  code *pcVar11;
  WhereTerm *pWVar12;
  Vdbe *pVVar13;
  char cVar14;
  char cVar15;
  byte bVar16;
  ushort uVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  Bitmask BVar21;
  Expr *pEVar22;
  WhereOrInfo *pWC_00;
  CollSeq *pCVar23;
  FuncDef *pFVar24;
  sqlite3_value *pVal;
  byte *pbVar25;
  undefined8 *puVar26;
  ulong uVar27;
  Expr *pEVar28;
  Select *pSVar29;
  WhereOrInfo *pWC_01;
  WhereTerm *pWVar30;
  Expr *pEVar31;
  ExprList *pEVar32;
  Expr *pEVar33;
  Op *pOVar34;
  size_t sVar35;
  byte bVar36;
  ExprList_item *pEVar37;
  long lVar38;
  byte bVar39;
  ulong uVar40;
  ushort uVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  int iVar45;
  WhereTerm *pWVar46;
  ulong uVar47;
  bool bVar48;
  int iVar49;
  short sVar50;
  SrcList *pSVar51;
  WhereTerm *pWVar52;
  SrcList *pSVar53;
  u8 uVar54;
  long lVar55;
  char *pcVar56;
  Expr *pLeft;
  SrcList *pSVar57;
  bool bVar58;
  int aiCurCol [2];
  WhereTerm *local_d0;
  ulong local_b8;
  Token local_68;
  sqlite3_value *local_58;
  ulong local_50;
  ulong local_48;
  Expr *local_40;
  undefined1 local_38 [8];
  
  pWVar8 = pWC->pWInfo;
  pParse = pWVar8->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pWVar30 = pWC->a;
  pMaskSet = &pWVar8->sMaskSet;
  pEVar31 = pWVar30[idxTerm].pExpr;
  if (pEVar31->pLeft == (Expr *)0x0) {
    local_b8 = 0;
  }
  else {
    local_b8 = sqlite3WhereExprUsageNN(pMaskSet,pEVar31->pLeft);
  }
  pWVar30 = pWVar30 + idxTerm;
  bVar16 = pEVar31->op;
  if (bVar16 == 0x32) {
    pWVar30->prereqRight = 0;
  }
  else if (bVar16 == 0x31) {
    iVar19 = sqlite3ExprCheckIN(pParse,pEVar31);
    if (iVar19 != 0) {
      return;
    }
    if ((pEVar31->flags & 0x800) == 0) {
      BVar21 = sqlite3WhereExprListUsage(pMaskSet,(pEVar31->x).pList);
    }
    else {
      BVar21 = exprSelectUsage(pMaskSet,(Select *)(pEVar31->x).pList);
    }
    pWVar30->prereqRight = BVar21;
  }
  else {
    if (pEVar31->pRight == (Expr *)0x0) {
      BVar21 = 0;
    }
    else {
      BVar21 = sqlite3WhereExprUsageNN(pMaskSet,pEVar31->pRight);
    }
    pWVar30->prereqRight = BVar21;
  }
  pMaskSet->bVarSelect = 0;
  BVar21 = sqlite3WhereExprUsageNN(pMaskSet,pEVar31);
  if (pMaskSet->bVarSelect != 0) {
    pbVar25 = (byte *)((long)&pWVar30->wtFlags + 1);
    *pbVar25 = *pbVar25 | 0x10;
  }
  if ((pEVar31->flags & 1) != 0) {
    uVar27 = (ulong)(pWVar8->sMaskSet).n;
    if (0 < (long)uVar27) {
      uVar44 = 0;
      do {
        if ((pWVar8->sMaskSet).ix[uVar44] == (int)pEVar31->iRightJoinTable) {
          local_50 = 1L << ((byte)uVar44 & 0x3f);
          BVar21 = BVar21 | 1L << (uVar44 & 0x3f);
          if (BVar21 >> 1 < local_50) {
            local_50 = local_50 - 1;
            goto LAB_0018269d;
          }
          break;
        }
        uVar44 = uVar44 + 1;
      } while (uVar27 != uVar44);
    }
    sqlite3ErrorMsg(pParse,"ON clause references tables to its right");
    return;
  }
  local_50 = 0;
LAB_0018269d:
  pWVar30->prereqAll = BVar21;
  pWVar30->iParent = -1;
  pWVar30->leftCursor = -1;
  pWVar30->eOperator = 0;
  uVar42 = (uint)bVar16;
  if ((uVar42 < 0x3a) && ((0x3e6200000000000U >> ((ulong)uVar42 & 0x3f) & 1) != 0)) {
    pEVar22 = pEVar31->pLeft;
    if (pEVar22 == (Expr *)0x0) {
      pEVar22 = (Expr *)0x0;
    }
    else {
      do {
        if ((pEVar22->flags >> 0xc & 1) == 0) goto LAB_00182752;
        if ((pEVar22->flags >> 0x12 & 1) == 0) {
          pEVar37 = (ExprList_item *)&pEVar22->pLeft;
        }
        else {
          pEVar37 = ((pEVar22->x).pList)->a;
        }
        pEVar22 = pEVar37->pExpr;
      } while (pEVar22 != (Expr *)0x0);
      pEVar22 = (Expr *)0x0;
    }
LAB_00182752:
    pEVar28 = pEVar31->pRight;
    while (pEVar28 != (Expr *)0x0) {
      if ((pEVar28->flags >> 0xc & 1) == 0) goto LAB_00182784;
      if ((pEVar28->flags >> 0x12 & 1) == 0) {
        pEVar37 = (ExprList_item *)&pEVar28->pLeft;
      }
      else {
        pEVar37 = ((pEVar28->x).pList)->a;
      }
      pEVar28 = pEVar37->pExpr;
    }
    pEVar28 = (Expr *)0x0;
LAB_00182784:
    uVar41 = 0x800;
    if ((pWVar30->prereqRight & local_b8) == 0) {
      uVar41 = 0x1fff;
    }
    if (0 < pWVar30->iField) {
      pEVar22 = ((pEVar22->x).pList)->a[pWVar30->iField - 1].pExpr;
    }
    iVar19 = exprMightBeIndexed(pSrc,local_b8,(int *)&local_68,pEVar22,uVar42);
    uVar43 = (uint)bVar16;
    if (iVar19 != 0) {
      pWVar30->leftCursor = (int)local_68.z;
      (pWVar30->u).leftColumn = local_68.z._4_4_;
      if (uVar42 == 0x2d) {
        uVar17 = 0x80;
      }
      else if (uVar43 == 0x31) {
        uVar17 = 1;
      }
      else if (uVar43 == 0x32) {
        uVar17 = 0x100;
      }
      else {
        uVar17 = (ushort)(2 << (bVar16 - 0x35 & 0x1f));
      }
      pWVar30->eOperator = uVar41 & uVar17;
    }
    if (uVar43 == 0x2d) {
      pbVar25 = (byte *)((long)&pWVar30->wtFlags + 1);
      *pbVar25 = *pbVar25 | 8;
    }
    if ((pEVar28 != (Expr *)0x0) &&
       (iVar19 = exprMightBeIndexed(pSrc,pWVar30->prereqRight,(int *)&local_68,pEVar28,uVar43),
       iVar19 != 0)) {
      if (pWVar30->leftCursor < 0) {
        sVar50 = 0;
        pEVar22 = pEVar31;
        local_d0 = pWVar30;
      }
      else {
        if (pEVar31 == (Expr *)0x0) {
          if (db->mallocFailed != '\0') {
            return;
          }
          pEVar22 = (Expr *)0x0;
        }
        else {
          pEVar22 = exprDup(db,pEVar31,0,(u8 **)0x0);
          if (db->mallocFailed != '\0') {
            if (pEVar22 == (Expr *)0x0) {
              return;
            }
            sqlite3ExprDeleteNN(db,pEVar22);
            return;
          }
        }
        iVar19 = whereClauseInsert(pWC,pEVar22,3);
        if (iVar19 == 0) {
          return;
        }
        pWVar30 = pWC->a;
        local_d0 = pWVar30 + iVar19;
        pWVar30[iVar19].iParent = idxTerm;
        pWVar30[iVar19].truthProb = pWVar30[idxTerm].truthProb;
        pWVar30[idxTerm].nChild = pWVar30[idxTerm].nChild + '\x01';
        if (uVar43 == 0x2d) {
          pbVar25 = (byte *)((long)&local_d0->wtFlags + 1);
          *pbVar25 = *pbVar25 | 8;
        }
        *(byte *)&pWVar30[idxTerm].wtFlags = (byte)pWVar30[idxTerm].wtFlags | 8;
        pWVar30 = pWVar30 + idxTerm;
        iVar19 = termIsEquivalence(pParse,pEVar22);
        if (iVar19 == 0) {
          sVar50 = 0;
        }
        else {
          pbVar25 = (byte *)((long)&pWVar30->eOperator + 1);
          *pbVar25 = *pbVar25 | 8;
          sVar50 = 0x800;
        }
      }
      pEVar28 = pEVar22->pLeft;
      uVar42 = pEVar22->pRight->flags;
      if (((pEVar28->flags ^ uVar42) >> 8 & 1) == 0) {
        if ((uVar42 >> 8 & 1) == 0) {
          pCVar23 = sqlite3ExprCollSeq(pParse,pEVar28);
          pEVar28 = pEVar22->pLeft;
          if (pCVar23 != (CollSeq *)0x0) {
            pbVar25 = (byte *)((long)&pEVar28->flags + 1);
            *pbVar25 = *pbVar25 | 1;
          }
        }
        else {
          pEVar22->pRight->flags = uVar42 & 0xfffffeff;
        }
      }
      pEVar33 = pEVar22->pRight;
      pEVar22->pRight = pEVar28;
      pEVar22->pLeft = pEVar33;
      if (0x35 < pEVar22->op) {
        pEVar22->op = (pEVar22->op - 0x36 ^ 2) + 0x36;
      }
      local_d0->leftCursor = (int)local_68.z;
      (local_d0->u).leftColumn = local_68.z._4_4_;
      local_d0->prereqRight = local_b8 | local_50;
      local_d0->prereqAll = BVar21;
      uVar54 = pEVar22->op;
      if (uVar54 == '-') {
        sVar18 = 0x80;
      }
      else if (uVar54 == '1') {
        sVar18 = 1;
      }
      else if (uVar54 == '2') {
        sVar18 = 0x100;
      }
      else {
        sVar18 = (short)(2 << (uVar54 - 0x35 & 0x1f));
      }
      local_d0->eOperator = uVar41 & sVar50 + sVar18;
    }
    goto LAB_00182cd7;
  }
  bVar16 = pEVar31->op;
  if (bVar16 == 0x2b) {
    pWVar8 = pWC->pWInfo;
    pWVar30 = pWC->a;
    pParse_00 = pWVar8->pParse;
    psVar9 = pParse_00->db;
    pEVar22 = pWVar30[idxTerm].pExpr;
    pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(psVar9,0x230);
    pWVar30[idxTerm].u.pOrInfo = pWC_00;
    if (pWC_00 != (WhereOrInfo *)0x0) {
      *(byte *)&pWVar30[idxTerm].wtFlags = (byte)pWVar30[idxTerm].wtFlags | 0x10;
      pWVar52 = (pWC_00->wc).aStatic;
      memset(pWVar52,0,0x200);
      (pWC_00->wc).pWInfo = pWVar8;
      (pWC_00->wc).hasOr = '\0';
      (pWC_00->wc).pOuter = (WhereClause *)0x0;
      (pWC_00->wc).nTerm = 0;
      (pWC_00->wc).nSlot = 8;
      (pWC_00->wc).a = pWVar52;
      sqlite3WhereSplit((WhereClause *)pWC_00,pEVar22,'+');
      iVar19 = (pWC_00->wc).nTerm;
      if (0 < iVar19) {
        uVar42 = iVar19 + 1;
        do {
          exprAnalyze(pSrc,(WhereClause *)pWC_00,uVar42 - 2);
          uVar42 = uVar42 - 1;
        } while (1 < uVar42);
      }
      if (psVar9->mallocFailed == '\0') {
        iVar19 = (pWC_00->wc).nTerm;
        if (iVar19 < 1) {
          pWC_00->indexable = 0xffffffffffffffff;
          pWVar30[idxTerm].eOperator = 0x200;
          pWC->hasOr = '\x01';
          uVar27 = 0xffffffffffffffff;
LAB_001839fd:
          uVar44 = 0;
          bVar58 = false;
          iVar19 = -1;
LAB_00183a0c:
          iVar45 = (pWC_00->wc).nTerm;
          if (0 < iVar45) {
            pWVar30 = (pWC_00->wc).a;
            do {
              *(byte *)&pWVar30->wtFlags = (byte)pWVar30->wtFlags & 0xbf;
              iVar20 = pWVar30->leftCursor;
              if (iVar20 != iVar19) {
                lVar55 = (long)(pWVar8->sMaskSet).n;
                if (0 < lVar55) {
                  lVar38 = 0;
                  do {
                    if ((pWVar8->sMaskSet).ix[lVar38] == iVar20) {
                      uVar40 = 1L << ((byte)lVar38 & 0x3f);
                      goto LAB_00183a5b;
                    }
                    lVar38 = lVar38 + 1;
                  } while (lVar55 != lVar38);
                }
                uVar40 = 0;
LAB_00183a5b:
                if ((uVar27 & uVar40) != 0) goto LAB_00183a75;
              }
              pWVar30 = pWVar30 + 1;
              bVar48 = iVar45 < 2;
              iVar45 = iVar45 + -1;
              if (bVar48) break;
            } while( true );
          }
          goto LAB_00183b5f;
        }
        pWVar52 = (pWC_00->wc).a;
        uVar27 = 0xffffffffffffffff;
        uVar44 = 0xffffffffffffffff;
        do {
          if ((pWVar52->eOperator & 0x1ff) == 0) {
            pWC_01 = (WhereOrInfo *)sqlite3DbMallocRawNN(psVar9,0x228);
            if (pWC_01 == (WhereOrInfo *)0x0) {
              uVar27 = 0;
            }
            else {
              (pWVar52->u).pOrInfo = pWC_01;
              *(byte *)&pWVar52->wtFlags = (byte)pWVar52->wtFlags | 0x20;
              pWVar52->eOperator = 0x400;
              pWVar46 = (pWC_01->wc).aStatic;
              memset(pWVar46,0,0x200);
              (pWC_01->wc).pWInfo = pWC->pWInfo;
              (pWC_01->wc).hasOr = '\0';
              (pWC_01->wc).pOuter = (WhereClause *)0x0;
              (pWC_01->wc).nTerm = 0;
              (pWC_01->wc).nSlot = 8;
              (pWC_01->wc).a = pWVar46;
              sqlite3WhereSplit((WhereClause *)pWC_01,pWVar52->pExpr,',');
              iVar45 = (pWC_01->wc).nTerm;
              if (0 < iVar45) {
                uVar42 = iVar45 + 1;
                do {
                  exprAnalyze(pSrc,(WhereClause *)pWC_01,uVar42 - 2);
                  uVar42 = uVar42 - 1;
                } while (1 < uVar42);
              }
              (pWC_01->wc).pOuter = pWC;
              if (psVar9->mallocFailed == '\0') {
                iVar45 = (pWC_01->wc).nTerm;
                if (iVar45 < 1) {
                  uVar27 = 0;
                }
                else {
                  pWVar46 = (pWC_01->wc).a;
                  iVar20 = 0;
                  uVar27 = 0;
                  do {
                    uVar40 = (ulong)pWVar46->pExpr->op;
                    if (((uVar40 < 0x3a) && ((0x3e6200000000000U >> (uVar40 & 0x3f) & 1) != 0)) ||
                       (pWVar46->eOperator == 0x40)) {
                      lVar55 = (long)(pWVar8->sMaskSet).n;
                      if (0 < lVar55) {
                        lVar38 = 0;
                        do {
                          if ((pWVar8->sMaskSet).ix[lVar38] == pWVar46->leftCursor) {
                            uVar40 = 1L << ((byte)lVar38 & 0x3f);
                            goto LAB_00183565;
                          }
                          lVar38 = lVar38 + 1;
                        } while (lVar55 != lVar38);
                      }
                      uVar40 = 0;
LAB_00183565:
                      uVar27 = uVar27 | uVar40;
                    }
                    iVar20 = iVar20 + 1;
                    pWVar46 = pWVar46 + 1;
                  } while (iVar20 != iVar45);
                }
              }
              else {
                uVar27 = 0;
              }
              uVar44 = uVar44 & uVar27;
              uVar27 = 0;
            }
          }
          else {
            uVar41 = pWVar52->wtFlags;
            if ((uVar41 & 8) == 0) {
              lVar55 = (long)(pWVar8->sMaskSet).n;
              if (lVar55 < 1) {
                uVar40 = 0;
                uVar47 = 0;
                if ((uVar41 & 2) != 0) goto LAB_00183588;
              }
              else {
                lVar38 = 0;
                do {
                  if ((pWVar8->sMaskSet).ix[lVar38] == pWVar52->leftCursor) {
                    uVar40 = 1L << ((byte)lVar38 & 0x3f);
                    goto LAB_001834bf;
                  }
                  lVar38 = lVar38 + 1;
                } while (lVar55 != lVar38);
                uVar40 = 0;
LAB_001834bf:
                if ((uVar41 & 2) != 0) {
                  lVar38 = 0;
                  do {
                    if ((pWVar8->sMaskSet).ix[lVar38] == (pWC_00->wc).a[pWVar52->iParent].leftCursor
                       ) {
                      uVar47 = 1L << ((byte)lVar38 & 0x3f);
                      goto LAB_00183588;
                    }
                    lVar38 = lVar38 + 1;
                  } while (lVar55 != lVar38);
                  uVar47 = 0;
LAB_00183588:
                  uVar40 = uVar40 | uVar47;
                }
              }
              uVar44 = uVar44 & uVar40;
              uVar27 = uVar27 & uVar40;
              if ((pWVar52->eOperator & 2) == 0) {
                uVar27 = 0;
              }
            }
          }
          if (iVar19 < 2) break;
          iVar19 = iVar19 + -1;
          pWVar52 = pWVar52 + 1;
        } while (uVar44 != 0);
        pWC_00->indexable = uVar44;
        if (uVar44 == 0) {
          pWVar30[idxTerm].eOperator = 0x200;
        }
        else {
          iVar19 = (pWC_00->wc).nTerm;
          pWVar30[idxTerm].eOperator = 0x200;
          pWC->hasOr = '\x01';
          if (iVar19 == 2) {
            pWVar30 = (pWC_00->wc).a;
            lVar55 = 0;
LAB_001835f9:
            if (pWVar30->eOperator == 0x400) {
              if (((((pWVar30->u).pOrInfo)->wc).nTerm <= lVar55) ||
                 (pWVar52 = (((pWVar30->u).pOrInfo)->wc).a, pWVar52 == (WhereTerm *)0x0))
              goto LAB_001839ef;
              pWVar52 = pWVar52 + lVar55;
            }
            else {
              pWVar52 = pWVar30;
              if (lVar55 != 0) goto LAB_001839ef;
            }
            lVar55 = lVar55 + 1;
            lVar38 = 0;
            do {
              if (pWVar30[1].eOperator == 0x400) {
                if ((((pWVar30[1].u.pOrInfo)->wc).nTerm <= lVar38) ||
                   (pWVar12 = ((pWVar30[1].u.pOrInfo)->wc).a, pWVar46 = pWVar12 + lVar38,
                   pWVar12 == (WhereTerm *)0x0)) goto LAB_001835f9;
              }
              else {
                pWVar46 = pWVar30 + 1;
                if (lVar38 != 0) goto LAB_001835f9;
              }
              if (((pWVar52->eOperator & 0x3e) != 0) &&
                 (((((pWVar46->eOperator & 0x3e) != 0 &&
                    (uVar41 = pWVar46->eOperator | pWVar52->eOperator,
                    (uVar41 & 0xffe5) == 0 || (uVar41 & 0xffd9) == 0)) &&
                   (iVar19 = sqlite3ExprCompare((Parse *)0x0,pWVar52->pExpr->pLeft,
                                                pWVar46->pExpr->pLeft,-1), iVar19 == 0)) &&
                  (iVar19 = sqlite3ExprCompare((Parse *)0x0,pWVar52->pExpr->pRight,
                                               pWVar46->pExpr->pRight,-1), iVar19 == 0)))) {
                uVar17 = 8;
                if ((uVar41 & 0x18) == 0) {
                  uVar17 = 0x20;
                }
                if ((uVar41 + 0x3f & uVar41) != 0) {
                  uVar41 = uVar17;
                }
                if ((pWVar52->pExpr != (Expr *)0x0) &&
                   (pEVar28 = exprDup(pWC->pWInfo->pParse->db,pWVar52->pExpr,0,(u8 **)0x0),
                   pEVar28 != (Expr *)0x0)) {
                  bVar16 = 0;
                  do {
                    bVar36 = bVar16;
                    bVar16 = bVar36 + 1;
                  } while (2 << (bVar36 & 0x1f) != (uint)uVar41);
                  pEVar28->op = bVar36 + 0x35;
                  iVar19 = whereClauseInsert(pWC,pEVar28,3);
                  exprAnalyze(pSrc,pWC,iVar19);
                }
              }
              lVar38 = lVar38 + 1;
              pWVar30 = (pWC_00->wc).a;
            } while( true );
          }
        }
LAB_001839ef:
        if (uVar27 != 0) goto LAB_001839fd;
      }
    }
    goto LAB_00182bd5;
  }
  if ((bVar16 == 0x30) && (bVar16 = 0x30, pWC->op == ',')) {
    pEVar32 = (pEVar31->x).pList;
    lVar55 = 0;
    bVar58 = true;
    do {
      bVar48 = bVar58;
      bVar16 = "97"[lVar55];
      if (pEVar31->pLeft == (Expr *)0x0) {
        pEVar22 = (Expr *)0x0;
      }
      else {
        pEVar22 = exprDup(db,pEVar31->pLeft,0,(u8 **)0x0);
      }
      pEVar28 = pEVar32->a[lVar55].pExpr;
      if (pEVar28 == (Expr *)0x0) {
        pEVar28 = (Expr *)0x0;
      }
      else {
        pEVar28 = exprDup(db,pEVar28,0,(u8 **)0x0);
      }
      pEVar22 = sqlite3PExpr(pParse,(uint)bVar16,pEVar22,pEVar28);
      if (pEVar22 != (Expr *)0x0) {
        pEVar22->flags = pEVar22->flags | pEVar31->flags & 1;
        pEVar22->iRightJoinTable = pEVar31->iRightJoinTable;
      }
      iVar19 = whereClauseInsert(pWC,pEVar22,3);
      exprAnalyze(pSrc,pWC,iVar19);
      pWVar30 = pWC->a;
      pWVar30[iVar19].iParent = idxTerm;
      pWVar30[iVar19].truthProb = pWVar30[idxTerm].truthProb;
      pWVar30[idxTerm].nChild = pWVar30[idxTerm].nChild + '\x01';
      lVar55 = 1;
      bVar58 = false;
    } while (bVar48);
    pWVar30 = pWVar30 + idxTerm;
    goto LAB_00182cd7;
  }
LAB_00182cdd:
  if (pWC->op == ',') {
    if (bVar16 == 0xa1) {
      if ((pEVar31->x).pList != (ExprList *)0x0) {
        psVar9 = pParse->db;
        iVar19 = ((pEVar31->x).pList)->nExpr;
        pFVar24 = sqlite3FindFunction(psVar9,(pEVar31->u).zToken,iVar19,'\x01','\0');
        if ((pFVar24 != (FuncDef *)0x0) && (uVar42 = pFVar24->funcFlags, (uVar42 & 4) != 0)) {
          pEVar32 = (pEVar31->x).pList;
          if (iVar19 < 3) {
            bVar16 = 0;
LAB_00182d68:
            pbVar25 = (byte *)pFVar24->pUserData;
            pEVar22 = pEVar32->a[0].pExpr;
            while ((pEVar22->flags >> 0xc & 1) != 0) {
              if ((pEVar22->flags >> 0x12 & 1) == 0) {
                pEVar37 = (ExprList_item *)&pEVar22->pLeft;
              }
              else {
                pEVar37 = ((pEVar22->x).pList)->a;
              }
              pEVar22 = pEVar37->pExpr;
            }
            bVar36 = *pbVar25;
            bVar3 = pbVar25[1];
            bVar4 = pbVar25[2];
            pEVar28 = *(Expr **)(pEVar32 + 1);
            uVar54 = pEVar22->op;
            if (uVar54 == 0x94) {
              if ((psVar9->flags & 0x800000) == 0) {
                sVar50 = pEVar22->iColumn;
                pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar50,(u8)pEVar28);
                if ((pVal == (sqlite3_value *)0x0) || ((pVal->flags & 0xf) != 2)) {
                  pbVar25 = (byte *)0x0;
                }
                else {
                  local_58 = pVal;
                  pbVar25 = (byte *)sqlite3ValueText(pVal,'\x01');
                  pVal = local_58;
                }
                uVar43 = 0x80000000;
                if (sVar50 < 0x20) {
                  uVar43 = 1 << ((char)sVar50 - 1U & 0x1f);
                }
                puVar1 = &pParse->pVdbe->expmask;
                *puVar1 = *puVar1 | uVar43;
                goto LAB_00183905;
              }
LAB_00183339:
              pVal = (sqlite3_value *)0x0;
            }
            else {
              if (uVar54 != 'n') goto LAB_00183339;
              pbVar25 = (byte *)(pEVar22->u).zToken;
              pVal = (sqlite3_value *)0x0;
LAB_00183905:
              if ((((pbVar25 != (byte *)0x0) && (bVar5 = *pbVar25, bVar5 != 0)) && (bVar5 != bVar36)
                  ) && ((bVar5 != bVar3 && (bVar5 != bVar4)))) {
                iVar19 = 0;
                bVar39 = bVar5;
                do {
                  uVar27 = (long)iVar19 + 1;
                  if ((bVar39 == bVar16) && (pbVar25[uVar27] != 0)) {
                    uVar27 = (ulong)(iVar19 + 2);
                  }
                  iVar19 = (int)uVar27;
                  bVar39 = pbVar25[iVar19];
                } while ((((bVar39 != 0) && (bVar39 != bVar36)) && (bVar39 != bVar3)) &&
                        (bVar39 != bVar4));
                if (((iVar19 != 0) && (pbVar25[(long)iVar19 + -1] != 0xff)) &&
                   ((1 < iVar19 || (bVar5 != bVar16)))) {
                  bVar58 = false;
                  if (bVar39 == bVar36) {
                    bVar58 = pbVar25[(long)iVar19 + 1] == 0;
                  }
                  pEVar33 = sqlite3Expr(psVar9,0x6e,(char *)pbVar25);
                  if (pEVar33 != (Expr *)0x0) {
                    pbVar25 = (byte *)(pEVar33->u).zToken;
                    pbVar25[iVar19] = 0;
                    if (iVar19 < 1) {
                      uVar27 = 0;
                    }
                    else {
                      uVar27 = 0;
                      iVar45 = 0;
                      do {
                        bVar36 = pbVar25[iVar45];
                        pbVar25[uVar27] =
                             pbVar25[(int)(iVar45 + (uint)((int)(char)bVar36 == (uint)bVar16))];
                        uVar27 = uVar27 + 1;
                        iVar45 = iVar45 + (uint)((int)(char)bVar36 == (uint)bVar16) + 1;
                      } while (iVar45 < iVar19);
                    }
                    pbVar25[uVar27 & 0xffffffff] = 0;
                    bVar16 = *pbVar25;
                    if ((((ulong)bVar16 - 0x30 < 10 || (ulong)bVar16 == 0x2d) ||
                        ((int)uVar27 == 1 && bVar16 == 0x2f)) &&
                       ((pEVar28->op != 0xa2 ||
                        ((cVar15 = sqlite3ExprAffinity(pEVar28), cVar15 != 'B' ||
                         (((pEVar28->y).pTab)->nModuleArg != 0)))))) {
                      sqlite3ExprDeleteNN(psVar9,pEVar33);
                      sqlite3ValueFree(pVal);
                      goto LAB_00182e54;
                    }
                  }
                  if (uVar54 == 0x94) {
                    pVVar13 = pParse->pVdbe;
                    uVar7 = pEVar22->iColumn;
                    uVar43 = 0x80000000;
                    if ((short)uVar7 < 0x20) {
                      uVar43 = 1 << ((char)uVar7 - 1U & 0x1f);
                    }
                    pVVar13->expmask = pVVar13->expmask | uVar43;
                    if ((bVar58) && ((pEVar22->u).zToken[1] != '\0')) {
                      if (pParse->nTempReg == '\0') {
                        iVar19 = pParse->nMem + 1;
                        pParse->nMem = iVar19;
                      }
                      else {
                        bVar16 = pParse->nTempReg - 1;
                        pParse->nTempReg = bVar16;
                        iVar19 = pParse->aTempReg[bVar16];
                      }
                      sqlite3ExprCodeTarget(pParse,pEVar22,iVar19);
                      if (pVVar13->db->mallocFailed == '\0') {
                        pOVar34 = pVVar13->aOp + (long)pVVar13->nOp + -1;
                      }
                      else {
                        pOVar34 = (Op *)&sqlite3VdbeGetOp_dummy;
                      }
                      pOVar34->p3 = 0;
                      if (iVar19 != 0) {
                        bVar16 = pParse->nTempReg;
                        if ((ulong)bVar16 < 8) {
                          pParse->nTempReg = bVar16 + 1;
                          pParse->aTempReg[bVar16] = iVar19;
                        }
                      }
                    }
                  }
                  sqlite3ValueFree(pVal);
                  pSVar57 = ((pEVar31->x).pSelect)->pSrc;
                  if (pEVar33 == (Expr *)0x0) {
                    pEVar22 = (Expr *)0x0;
                  }
                  else {
                    pEVar22 = exprDup(db,pEVar33,0,(u8 **)0x0);
                  }
                  if (((uVar42 & 8) == 0) && (pParse->db->mallocFailed == '\0')) {
                    pbVar25 = (byte *)((long)&pWVar30->wtFlags + 1);
                    *pbVar25 = *pbVar25 | 4;
                    pbVar25 = (byte *)(pEVar33->u).zToken;
                    bVar16 = *pbVar25;
                    if (bVar16 != 0) {
                      lVar55 = 1;
                      do {
                        *pbVar25 = bVar16 & (~""[bVar16] | 0xdf);
                        (pEVar22->u).zToken[lVar55 + -1] = ""[bVar16];
                        bVar16 = (pEVar33->u).zToken[lVar55];
                        pbVar25 = (byte *)((pEVar33->u).zToken + lVar55);
                        lVar55 = lVar55 + 1;
                      } while (bVar16 != 0);
                    }
                  }
                  if (db->mallocFailed == '\0') {
                    pcVar56 = (pEVar22->u).zToken;
                    if (pcVar56 == (char *)0x0) {
                      uVar27 = 0;
                    }
                    else {
                      sVar35 = strlen(pcVar56);
                      uVar27 = (ulong)((uint)sVar35 & 0x3fffffff);
                    }
                    bVar16 = pcVar56[uVar27 - 1];
                    if ((uVar42 & 8) == 0) {
                      if (bVar16 == 0x40) {
                        bVar58 = false;
                      }
                      bVar16 = ""[bVar16];
                    }
                    pcVar56[uVar27 - 1] = bVar16 + 1;
                  }
                  pcVar56 = "BINARY";
                  if ((uVar42 & 8) == 0) {
                    pcVar56 = "NOCASE";
                  }
                  if (pSVar57 == (SrcList *)0x0) {
                    pEVar28 = (Expr *)0x0;
                  }
                  else {
                    pEVar28 = exprDup(db,(Expr *)pSVar57,0,(u8 **)0x0);
                  }
                  local_68.n = 6;
                  local_68.z = pcVar56;
                  pEVar28 = sqlite3ExprAddCollateToken(pParse,pEVar28,&local_68,0);
                  pEVar28 = sqlite3PExpr(pParse,0x39,pEVar28,pEVar33);
                  if (pEVar28 != (Expr *)0x0) {
                    pEVar28->flags = pEVar28->flags | pEVar31->flags & 1;
                    pEVar28->iRightJoinTable = pEVar31->iRightJoinTable;
                  }
                  iVar19 = whereClauseInsert(pWC,pEVar28,0x103);
                  exprAnalyze(pSrc,pWC,iVar19);
                  if (pSVar57 == (SrcList *)0x0) {
                    pEVar28 = (Expr *)0x0;
                  }
                  else {
                    pEVar28 = exprDup(db,(Expr *)pSVar57,0,(u8 **)0x0);
                  }
                  local_68.n = 6;
                  local_68.z = pcVar56;
                  pEVar28 = sqlite3ExprAddCollateToken(pParse,pEVar28,&local_68,0);
                  pEVar22 = sqlite3PExpr(pParse,0x38,pEVar28,pEVar22);
                  if (pEVar22 != (Expr *)0x0) {
                    pEVar22->flags = pEVar22->flags | pEVar31->flags & 1;
                    pEVar22->iRightJoinTable = pEVar31->iRightJoinTable;
                  }
                  iVar45 = whereClauseInsert(pWC,pEVar22,0x103);
                  exprAnalyze(pSrc,pWC,iVar45);
                  pWVar52 = pWC->a;
                  pWVar30 = pWVar52 + idxTerm;
                  if (bVar58) {
                    pWVar52[iVar19].iParent = idxTerm;
                    LVar6 = pWVar52[idxTerm].truthProb;
                    pWVar52[iVar19].truthProb = LVar6;
                    uVar54 = pWVar52[idxTerm].nChild;
                    pWVar52[iVar45].iParent = idxTerm;
                    pWVar52[iVar45].truthProb = LVar6;
                    pWVar52[idxTerm].nChild = uVar54 + '\x02';
                  }
                  goto LAB_00182e54;
                }
              }
            }
            sqlite3ValueFree(pVal);
          }
          else {
            pcVar56 = *(char **)&pEVar32[1].a[0].sortOrder;
            if (*pcVar56 == 'n') {
              pbVar25 = *(byte **)(pcVar56 + 8);
              bVar16 = *pbVar25;
              if ((bVar16 != 0) && (pbVar25[1] == 0)) goto LAB_00182d68;
            }
          }
        }
      }
LAB_00182e54:
      bVar16 = pEVar31->op;
      if (pWC->op != ',') goto LAB_0018379f;
    }
    else {
      bVar16 = pEVar31->op;
    }
    uVar42 = (uint)bVar16;
    if ((uVar42 - 0x33 < 2) || (uVar42 == 0xa0)) {
      pSVar51 = (SrcList *)pEVar31->pLeft;
      pSVar57 = (SrcList *)pEVar31->pRight;
      uVar43 = 0;
      if ((char)pSVar51->nSrc == -0x5e) {
        uVar43 = (uint)(*(int *)(*(long *)&pSVar51->a[0].regResult + 0x54) != 0);
      }
      pSVar53 = pSVar51;
      if (pSVar57 == (SrcList *)0x0) {
        pSVar57 = (SrcList *)0x0;
      }
      else if (((char)pSVar57->nSrc == -0x5e) &&
              (*(int *)(*(long *)&pSVar57->a[0].regResult + 0x54) != 0)) {
        uVar43 = uVar43 + 1;
        pSVar53 = pSVar57;
        pSVar57 = pSVar51;
      }
      if (bVar16 == 0xa0) {
        uVar54 = 'E';
      }
      else if (uVar42 == 0x34) {
        uVar54 = 'D';
      }
      else if (uVar42 == 0x33) {
        uVar54 = 'F';
      }
      else {
        uVar54 = '\0';
      }
      if (uVar43 != 0) {
LAB_00182fdc:
        uVar43 = uVar43 + 1;
        do {
          pSVar51 = pSVar53;
          if (pSVar57 == (SrcList *)0x0) {
            BVar21 = 0;
          }
          else {
            BVar21 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pSVar57);
          }
          if (pSVar51 == (SrcList *)0x0) {
            uVar27 = 0;
          }
          else {
            uVar27 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pSVar51);
          }
          if ((uVar27 & BVar21) == 0) {
            if (pSVar57 == (SrcList *)0x0) {
              pEVar22 = (Expr *)0x0;
            }
            else {
              pEVar22 = exprDup(db,(Expr *)pSVar57,0,(u8 **)0x0);
            }
            pEVar22 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar22);
            if (((pEVar31->flags & 1) != 0) && (pEVar22 != (Expr *)0x0)) {
              *(byte *)&pEVar22->flags = (byte)pEVar22->flags | 1;
            }
            iVar19 = whereClauseInsert(pWC,pEVar22,3);
            pWVar52 = pWC->a;
            pWVar52[iVar19].prereqRight = BVar21;
            pWVar52[iVar19].leftCursor = *(int *)((long)&pSVar51->a[0].pTab + 4);
            *(int *)&pWVar52[iVar19].u = (int)*(short *)&pSVar51->a[0].pSelect;
            pWVar52[iVar19].eOperator = 0x40;
            pWVar52[iVar19].eMatchOp = uVar54;
            pWVar46 = pWC->a;
            pWVar46[iVar19].iParent = idxTerm;
            pWVar46[iVar19].truthProb = pWVar46[idxTerm].truthProb;
            pWVar46[idxTerm].nChild = pWVar46[idxTerm].nChild + '\x01';
            *(byte *)&pWVar46[idxTerm].wtFlags = (byte)pWVar46[idxTerm].wtFlags | 8;
            pWVar30 = pWVar46 + idxTerm;
            pWVar52[iVar19].prereqAll = pWVar46[idxTerm].prereqAll;
          }
          uVar43 = uVar43 - 1;
          pSVar53 = pSVar57;
          pSVar57 = pSVar51;
        } while (1 < uVar43);
      }
    }
    else if (((uVar42 == 0xa1) && (pSVar29 = (pEVar31->x).pSelect, pSVar29 != (Select *)0x0)) &&
            (*(int *)&pSVar29->pEList == 2)) {
      pSVar53 = pSVar29->pSrc;
      if (((char)pSVar53->nSrc == -0x5e) &&
         (*(int *)(*(long *)&pSVar53->a[0].regResult + 0x54) != 0)) {
        pcVar56 = (pEVar31->u).zToken;
        lVar55 = 0;
        do {
          iVar19 = sqlite3StrICmp(pcVar56,*(char **)((long)&isAuxiliaryVtabOperator_aOp + lVar55));
          if (iVar19 == 0) {
            uVar54 = (&DAT_0020ccb8)[lVar55];
            pSVar57 = *(SrcList **)&pSVar29->op;
            goto LAB_001839d5;
          }
          lVar55 = lVar55 + 0x10;
        } while (lVar55 != 0x40);
      }
      pSVar53 = *(SrcList **)&pSVar29->op;
      if (((char)pSVar53->nSrc == -0x5e) &&
         (lVar55 = *(long *)&pSVar53->a[0].regResult, *(int *)(lVar55 + 0x54) != 0)) {
        puVar26 = (undefined8 *)(lVar55 + 0x60);
        do {
          puVar10 = (undefined8 *)*puVar26;
          puVar26 = puVar10 + 5;
        } while ((sqlite3 *)*puVar10 != db);
        pcVar11 = *(code **)(*(long *)puVar10[2] + 0x90);
        if ((pcVar11 != (code *)0x0) &&
           (iVar19 = (*pcVar11)((long *)puVar10[2],2,(pEVar31->u).zToken,&local_68,local_38),
           0x95 < iVar19)) {
          uVar54 = (u8)iVar19;
          pSVar57 = pSVar29->pSrc;
LAB_001839d5:
          uVar43 = 1;
          goto LAB_00182fdc;
        }
      }
    }
    bVar16 = pEVar31->op;
    if (pWC->op == ',') {
      if ((bVar16 == 0x35) || (bVar16 == 0x2d)) {
        pEVar22 = pEVar31->pLeft;
        uVar54 = pEVar22->op;
        if (uVar54 == 0xa8) {
          uVar54 = pEVar22->op2;
        }
        if (uVar54 == 0x83) {
          pSVar29 = (pEVar22->x).pSelect;
        }
        else {
          if (uVar54 != 0xa9) goto LAB_00183250;
          pSVar29 = (Select *)&pEVar22->x;
        }
        iVar19 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar29->pEList)->pList->nExpr;
        if (1 < iVar19) {
          pEVar28 = pEVar31->pRight;
          uVar54 = pEVar28->op;
          if (uVar54 == 0xa8) {
            uVar54 = pEVar28->op2;
          }
          if (uVar54 == 0x83) {
            pSVar29 = (pEVar28->x).pSelect;
LAB_00183187:
            iVar45 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar29->pEList)->pList->nExpr;
          }
          else {
            iVar45 = 1;
            if (uVar54 == 0xa9) {
              pSVar29 = (Select *)&pEVar28->x;
              goto LAB_00183187;
            }
          }
          if ((iVar45 == iVar19) &&
             (((pEVar22->flags & 0x800) == 0 || ((pEVar28->flags & 0x800) == 0)))) {
            iVar45 = 0;
            do {
              pEVar22 = sqlite3ExprForVectorField(pParse,pEVar31->pLeft,iVar45);
              pEVar28 = sqlite3ExprForVectorField(pParse,pEVar31->pRight,iVar45);
              pEVar22 = sqlite3PExpr(pParse,(uint)pEVar31->op,pEVar22,pEVar28);
              if (pEVar22 != (Expr *)0x0) {
                pEVar22->flags = pEVar22->flags | pEVar31->flags & 1;
                pEVar22->iRightJoinTable = pEVar31->iRightJoinTable;
              }
              iVar20 = whereClauseInsert(pWC,pEVar22,1);
              exprAnalyze(pSrc,pWC,iVar20);
              iVar45 = iVar45 + 1;
            } while (iVar19 != iVar45);
            bVar16 = pEVar31->op;
            uVar54 = pWC->op;
            pWVar30 = pWC->a;
            pWVar30[idxTerm].wtFlags = pWVar30[idxTerm].wtFlags | 6;
            pWVar30[idxTerm].eOperator = 0;
            if (uVar54 != ',') goto LAB_0018379f;
            pWVar30 = pWVar30 + idxTerm;
          }
        }
      }
LAB_00183250:
      if (bVar16 == 0x31) {
        if (((pWVar30->iField == 0) && (pEVar22 = pEVar31->pLeft, pEVar22->op == 0xa9)) &&
           (((pEVar31->x).pSelect)->pPrior == (Select *)0x0)) {
          uVar54 = 0xa9;
          iVar19 = 1;
          do {
            if (uVar54 == 0xa8) {
              uVar54 = pEVar22->op2;
            }
            if (uVar54 == 0x83) {
              pSVar29 = (pEVar22->x).pSelect;
LAB_001832ac:
              iVar45 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar29->pEList)->pList->nExpr;
            }
            else {
              iVar45 = 1;
              if (uVar54 == 0xa9) {
                pSVar29 = (Select *)&pEVar22->x;
                goto LAB_001832ac;
              }
            }
            if (iVar45 <= iVar19 + -1) goto LAB_0018379c;
            iVar45 = whereClauseInsert(pWC,pEVar31,2);
            pWC->a[iVar45].iField = iVar19;
            exprAnalyze(pSrc,pWC,iVar45);
            pWVar30 = pWC->a;
            pWVar30[iVar45].iParent = idxTerm;
            pWVar30[iVar45].truthProb = pWVar30[idxTerm].truthProb;
            pWVar30[idxTerm].nChild = pWVar30[idxTerm].nChild + '\x01';
            pEVar22 = pEVar31->pLeft;
            uVar54 = pEVar22->op;
            iVar19 = iVar19 + 1;
          } while( true );
        }
        goto LAB_001838b4;
      }
    }
  }
LAB_0018379f:
  if (((bVar16 == 0x33) && (pEVar22 = pEVar31->pLeft, pEVar22->op == 0xa2)) &&
     ((-1 < pEVar22->iColumn && (((pEVar31->flags & 1) == 0 && ((db->dbOptFlags & 0x800) == 0))))))
  {
    pEVar31 = exprDup(db,pEVar22,0,(u8 **)0x0);
    pEVar28 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
    if (pEVar28 != (Expr *)0x0) {
      pEVar28->op = '\0';
      pEVar28->affinity = '\0';
      *(undefined2 *)&pEVar28->field_0x2 = 0;
      pEVar28->flags = 0;
      (pEVar28->u).zToken = (char *)0x0;
      pEVar28->iColumn = 0;
      pEVar28->iAgg = 0;
      pEVar28->iRightJoinTable = 0;
      pEVar28->op2 = '\0';
      pEVar28->field_0x37 = 0;
      pEVar28->pAggInfo = (AggInfo *)0x0;
      (pEVar28->x).pList = (ExprList *)0x0;
      pEVar28->nHeight = 0;
      pEVar28->iTable = 0;
      pEVar28->pLeft = (Expr *)0x0;
      pEVar28->pRight = (Expr *)0x0;
      (pEVar28->y).pTab = (Table *)0x0;
      pEVar28->op = 'r';
      pEVar28->iAgg = -1;
      pEVar28->nHeight = 1;
    }
    pEVar31 = sqlite3PExpr(pParse,0x36,pEVar31,pEVar28);
    iVar19 = whereClauseInsert(pWC,pEVar31,0x83);
    if (iVar19 != 0) {
      pWVar30 = pWC->a;
      pWVar30[iVar19].prereqRight = 0;
      pWVar30[iVar19].leftCursor = pEVar22->iTable;
      *(int *)&pWVar30[iVar19].u = (int)pEVar22->iColumn;
      pWVar30[iVar19].eOperator = 4;
      pWVar52 = pWC->a;
      pWVar52[iVar19].iParent = idxTerm;
      pWVar52[iVar19].truthProb = pWVar52[idxTerm].truthProb;
      pWVar52[idxTerm].nChild = pWVar52[idxTerm].nChild + '\x01';
      *(byte *)&pWVar52[idxTerm].wtFlags = (byte)pWVar52[idxTerm].wtFlags | 8;
      pWVar30[iVar19].prereqAll = pWVar52[idxTerm].prereqAll;
    }
  }
LAB_001838b4:
  pBVar2 = &pWC->a[idxTerm].prereqRight;
  *pBVar2 = *pBVar2 | local_50;
  return;
LAB_00183a75:
  local_48 = uVar44;
  if (0 < iVar45) {
    iVar19 = (pWVar30->u).leftColumn;
    local_40 = pWVar30->pExpr->pLeft;
    iVar49 = 0;
    local_58 = (sqlite3_value *)CONCAT44(local_58._4_4_,iVar19);
    do {
      if (pWVar30->leftCursor == iVar20) {
        if ((pWVar30->u).leftColumn != iVar19) {
          bVar58 = false;
          goto LAB_00183b30;
        }
        bVar58 = false;
        pEVar28 = pWVar30->pExpr;
        if (iVar19 == -2) {
          iVar19 = sqlite3ExprCompare(pParse_00,pEVar28->pLeft,local_40,-1);
          if (iVar19 != 0) goto LAB_00183b30;
          pEVar28 = pWVar30->pExpr;
        }
        cVar15 = sqlite3ExprAffinity(pEVar28->pRight);
        cVar14 = sqlite3ExprAffinity(pWVar30->pExpr->pLeft);
        if ((cVar15 != '\0') && (cVar15 != cVar14)) goto LAB_00183b30;
        *(byte *)&pWVar30->wtFlags = (byte)pWVar30->wtFlags | 0x40;
        iVar19 = (int)local_58;
      }
      else {
        *(byte *)&pWVar30->wtFlags = (byte)pWVar30->wtFlags & 0xbf;
      }
      pWVar30 = pWVar30 + 1;
      iVar49 = iVar49 + 1;
    } while (iVar45 != iVar49);
  }
  bVar58 = true;
LAB_00183b30:
  uVar44 = (ulong)((int)local_48 + 1);
  iVar19 = iVar20;
  if ((int)local_48 != 0 || bVar58) goto LAB_00183b5f;
  goto LAB_00183a0c;
LAB_00183b5f:
  if (bVar58) {
    iVar19 = (pWC_00->wc).nTerm;
    if (iVar19 < 1) {
      pEVar32 = (ExprList *)0x0;
      pEVar28 = sqlite3PExpr(pParse_00,0x31,(Expr *)0x0,(Expr *)0x0);
      if (pEVar28 != (Expr *)0x0) goto LAB_00183c36;
    }
    else {
      pWVar30 = (pWC_00->wc).a;
      uVar42 = iVar19 + 1;
      pEVar28 = (Expr *)0x0;
      pEVar32 = (ExprList *)0x0;
      do {
        if ((pWVar30->wtFlags & 0x40) != 0) {
          pEVar28 = pWVar30->pExpr->pRight;
          if (pEVar28 == (Expr *)0x0) {
            pEVar28 = (Expr *)0x0;
          }
          else {
            pEVar28 = exprDup(psVar9,pEVar28,0,(u8 **)0x0);
          }
          pEVar32 = sqlite3ExprListAppend((Parse *)pWVar8->pParse->db,pEVar32,pEVar28);
          pEVar28 = pWVar30->pExpr->pLeft;
        }
        pWVar30 = pWVar30 + 1;
        uVar42 = uVar42 - 1;
      } while (1 < uVar42);
      if (pEVar28 == (Expr *)0x0) {
        pEVar28 = (Expr *)0x0;
      }
      else {
        pEVar28 = exprDup(psVar9,pEVar28,0,(u8 **)0x0);
      }
      pEVar28 = sqlite3PExpr(pParse_00,0x31,pEVar28,(Expr *)0x0);
      if (pEVar28 == (Expr *)0x0) {
        if (pEVar32 != (ExprList *)0x0) {
          exprListDeleteNN(psVar9,pEVar32);
        }
      }
      else {
LAB_00183c36:
        pEVar28->flags = pEVar28->flags | pEVar22->flags & 1;
        pEVar28->iRightJoinTable = pEVar22->iRightJoinTable;
        (pEVar28->x).pList = pEVar32;
        iVar19 = whereClauseInsert(pWC,pEVar28,3);
        exprAnalyze(pSrc,pWC,iVar19);
        pWVar30 = pWC->a;
        pWVar30[iVar19].iParent = idxTerm;
        pWVar30[iVar19].truthProb = pWVar30[idxTerm].truthProb;
        pWVar30[idxTerm].nChild = pWVar30[idxTerm].nChild + '\x01';
      }
    }
  }
LAB_00182bd5:
  pWVar30 = pWC->a + idxTerm;
LAB_00182cd7:
  bVar16 = pEVar31->op;
  goto LAB_00182cdd;
LAB_0018379c:
  bVar16 = pEVar31->op;
  goto LAB_0018379f;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}